

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::AccessorVerifier::~AccessorVerifier
          (AccessorVerifier *this)

{
  LogMessage *pLVar1;
  string local_90;
  byte local_69;
  LogMessage local_68;
  Voidify local_54;
  byte local_53;
  string local_50;
  byte local_29;
  LogMessage local_28;
  Voidify local_11;
  AccessorVerifier *local_10;
  AccessorVerifier *this_local;
  
  local_29 = 0;
  local_53 = 0;
  local_10 = this;
  if ((this->needs_annotate_ & 1U) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_28,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
               ,0x4da,"!needs_annotate_");
    local_29 = 1;
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_28);
    io::Printer::SourceLocation::current();
    cpp::(anonymous_namespace)::AccessorVerifier::Error_abi_cxx11_(&local_50,this);
    local_53 = 1;
    pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,&local_50);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_11,pLVar1);
  }
  if ((local_53 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((local_29 & 1) == 0) {
    local_69 = 0;
    if ((this->needs_weak_descriptor_pin_ & 1U) != 0) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_68,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/message.cc"
                 ,0x4db,"!needs_weak_descriptor_pin_");
      local_69 = 1;
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_68);
      io::Printer::SourceLocation::current();
      cpp::(anonymous_namespace)::AccessorVerifier::Error_abi_cxx11_(&local_90,this);
      pLVar1 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar1,&local_90);
      absl::lts_20250127::log_internal::Voidify::operator&&(&local_54,pLVar1);
      std::__cxx11::string::~string((string *)&local_90);
    }
    if ((local_69 & 1) == 0) {
      return;
    }
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_68);
  }
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

~AccessorVerifier() {
    ABSL_CHECK(!needs_annotate_) << Error(SourceLocation::current());
    ABSL_CHECK(!needs_weak_descriptor_pin_) << Error(SourceLocation::current());
  }